

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O0

void Sfm_NtkPrint(Sfm_Ntk_t *p)

{
  FILE *pFile;
  char cVar1;
  int nVars;
  Vec_Int_t *p_00;
  word *pTruth;
  Vec_Int_t *vArray;
  int i;
  Sfm_Ntk_t *p_local;
  
  for (vArray._4_4_ = 0; (int)vArray._4_4_ < p->nObjs; vArray._4_4_ = vArray._4_4_ + 1) {
    p_00 = Vec_WecEntry(&p->vFanins,vArray._4_4_);
    printf("Obj %3d : ",(ulong)vArray._4_4_);
    cVar1 = Vec_StrEntry(p->vFixed,vArray._4_4_);
    printf("Fixed %d  ",(ulong)(uint)(int)cVar1);
    cVar1 = Vec_StrEntry(p->vEmpty,vArray._4_4_);
    printf("Empty %d  ",(ulong)(uint)(int)cVar1);
    printf("Truth  ");
    pFile = _stdout;
    pTruth = Vec_WrdEntryP(p->vTruths,vArray._4_4_);
    nVars = Vec_IntSize(p_00);
    Extra_PrintHex(pFile,(uint *)pTruth,nVars);
    printf("  ");
    Vec_IntPrint(p_00);
  }
  return;
}

Assistant:

void Sfm_NtkPrint( Sfm_Ntk_t * p )
{
    int i;
    for ( i = 0; i < p->nObjs; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry( &p->vFanins, i );
        printf( "Obj %3d : ", i );
        printf( "Fixed %d  ", Vec_StrEntry(p->vFixed, i) );
        printf( "Empty %d  ", Vec_StrEntry(p->vEmpty, i) );
        printf( "Truth  " );
        Extra_PrintHex( stdout, (unsigned *)Vec_WrdEntryP(p->vTruths, i), Vec_IntSize(vArray) );
        printf( "  " );
        Vec_IntPrint( vArray );
    }
}